

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

amqp_link_t * amqp_create_link_for_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  amqp_pool_t *amount;
  void *__dest;
  void *in_RSI;
  amqp_pool_t *channel_pool;
  amqp_frame_t *frame_copy;
  amqp_link_t *link;
  undefined8 in_stack_ffffffffffffffd0;
  amqp_connection_state_t in_stack_ffffffffffffffd8;
  amqp_link_t *local_8;
  
  amount = amqp_get_or_create_channel_pool
                     (in_stack_ffffffffffffffd8,
                      (amqp_channel_t)((ulong)in_stack_ffffffffffffffd0 >> 0x30));
  if (amount == (amqp_pool_t *)0x0) {
    local_8 = (amqp_link_t *)0x0;
  }
  else {
    local_8 = (amqp_link_t *)
              amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffffd8,(size_t)amount);
    __dest = amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffffd8,(size_t)amount);
    if ((local_8 == (amqp_link_t *)0x0) || (__dest == (void *)0x0)) {
      local_8 = (amqp_link_t *)0x0;
    }
    else {
      memcpy(__dest,in_RSI,0x30);
      local_8->data = __dest;
    }
  }
  return local_8;
}

Assistant:

static amqp_link_t * amqp_create_link_for_frame(amqp_connection_state_t state, amqp_frame_t *frame)
{
  amqp_link_t *link;
  amqp_frame_t *frame_copy;

  amqp_pool_t *channel_pool = amqp_get_or_create_channel_pool(state, frame->channel);

  if (NULL == channel_pool) {
    return NULL;
  }

  link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));
  frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));

  if (NULL == link || NULL == frame_copy) {
    return NULL;
  }

  *frame_copy = *frame;
  link->data = frame_copy;

  return link;
}